

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int SMPI_Allreduce(void *sendbuf,void *recvbuf,int count,SMPI_Datatype datatype,SMPI_Op op,
                  SMPI_Comm comm)

{
  undefined4 in_ECX;
  SMPI_Comm in_stack_00000068;
  SMPI_Op in_stack_00000070;
  int in_stack_00000074;
  unsigned_long *in_stack_00000078;
  unsigned_long *in_stack_00000080;
  
  switch(in_ECX) {
  case 0:
    anon_unknown.dwarf_17824::SMPI_Allreduce_Impl<int>
              ((int *)in_stack_00000080,(int *)in_stack_00000078,in_stack_00000074,in_stack_00000070
               ,in_stack_00000068);
    break;
  case 1:
    anon_unknown.dwarf_17824::SMPI_Allreduce_Impl<long>
              ((long *)in_stack_00000080,(long *)in_stack_00000078,in_stack_00000074,
               in_stack_00000070,in_stack_00000068);
    break;
  case 2:
    anon_unknown.dwarf_17824::SMPI_Allreduce_Impl<unsigned_long>
              (in_stack_00000080,in_stack_00000078,in_stack_00000074,in_stack_00000070,
               in_stack_00000068);
    break;
  case 3:
    anon_unknown.dwarf_17824::SMPI_Allreduce_Impl<char>
              ((char *)in_stack_00000080,(char *)in_stack_00000078,in_stack_00000074,
               in_stack_00000070,in_stack_00000068);
    break;
  case 4:
    anon_unknown.dwarf_17824::SMPI_Allreduce_Impl<unsigned_char>
              ((uchar *)in_stack_00000080,(uchar *)in_stack_00000078,in_stack_00000074,
               in_stack_00000070,in_stack_00000068);
  }
  return 0;
}

Assistant:

int SMPI_Allreduce(const void *sendbuf, void *recvbuf, int count, SMPI_Datatype datatype,
                   SMPI_Op op, SMPI_Comm comm)
{
    switch (datatype)
    {
#define F(type)                                                                                    \
    SMPI_Allreduce_Impl(static_cast<const type *>(sendbuf), static_cast<type *>(recvbuf), count,   \
                        op, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}